

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall
adios2::core::IO::SetTransportParameter(IO *this,size_t transportIndex,string *key,string *value)

{
  int iVar1;
  mapped_type *pmVar2;
  pointer pmVar3;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  ScopedTimer __var2310;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)::__var310 ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)
                                 ::__var310);
    if (iVar1 != 0) {
      SetTransportParameter::__var310 = (void *)ps_timer_create_("IO::other");
      __cxa_guard_release(&SetTransportParameter(unsigned_long,std::__cxx11::string,std::__cxx11::string)
                           ::__var310);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2310,SetTransportParameter::__var310)
  ;
  pmVar3 = (this->m_TransportsParameters).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_TransportsParameters).
                     super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3) / 0x30) <=
      transportIndex) {
    std::__cxx11::string::string((string *)&local_40,"Core",&local_e9);
    std::__cxx11::string::string((string *)&local_60,"IO",&local_ea);
    std::__cxx11::string::string((string *)&local_80,"SetTransportParameter",&local_eb);
    std::__cxx11::to_string(&local_e0,transportIndex);
    std::operator+(&local_c0,"transport Index ",&local_e0);
    std::operator+(&local_a0,&local_c0," does not exist");
    helper::Throw<std::invalid_argument>(&local_40,&local_60,&local_80,&local_a0,-1);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pmVar3 = (this->m_TransportsParameters).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar3 + transportIndex,key);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2310);
  return;
}

Assistant:

void IO::SetTransportParameter(const size_t transportIndex, const std::string key,
                               const std::string value)
{
    PERFSTUBS_SCOPED_TIMER("IO::other");
    if (transportIndex >= m_TransportsParameters.size())
    {
        helper::Throw<std::invalid_argument>("Core", "IO", "SetTransportParameter",
                                             "transport Index " + std::to_string(transportIndex) +
                                                 " does not exist");
    }

    m_TransportsParameters[transportIndex][key] = value;
}